

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

size_t ServerNetworkLayerTCP_stop(UA_ServerNetworkLayer *nl,UA_Job **jobs)

{
  void *pvVar1;
  undefined8 uVar2;
  UA_Job *pUVar3;
  size_t i;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  long lVar7;
  
  pvVar1 = nl->handle;
  sVar6 = 0;
  UA_LOG_INFO(*(UA_Logger *)((long)pvVar1 + 0x18),UA_LOGCATEGORY_NETWORK,
              "Shutting down the TCP network layer with %d open connection(s)",
              *(undefined8 *)((long)pvVar1 + 0x28));
  shutdown(*(int *)((long)pvVar1 + 0x20),2);
  close(*(int *)((long)pvVar1 + 0x20));
  uVar5 = *(ulong *)((long)pvVar1 + 0x28);
  pUVar3 = (UA_Job *)malloc(uVar5 << 6);
  if (pUVar3 != (UA_Job *)0x0) {
    lVar7 = 0;
    for (uVar4 = 0; uVar4 < uVar5; uVar4 = uVar4 + 1) {
      socket_close(*(UA_Connection **)(*(long *)((long)pvVar1 + 0x30) + lVar7));
      (&pUVar3->type)[lVar7] = UA_JOBTYPE_DETACHCONNECTION;
      uVar2 = *(undefined8 *)(*(long *)((long)pvVar1 + 0x30) + lVar7);
      *(undefined8 *)((long)&pUVar3->job + lVar7 * 4) = uVar2;
      (&pUVar3[1].type)[lVar7] = UA_JOBTYPE_METHODCALL_DELAYED;
      *(code **)((long)&pUVar3[1].job + lVar7 * 4 + 8) = FreeConnectionCallback;
      *(undefined8 *)((long)&pUVar3[1].job + lVar7 * 4) = uVar2;
      uVar5 = *(ulong *)((long)pvVar1 + 0x28);
      lVar7 = lVar7 + 0x10;
    }
    *jobs = pUVar3;
    sVar6 = uVar5 * 2;
  }
  return sVar6;
}

Assistant:

static size_t
ServerNetworkLayerTCP_stop(UA_ServerNetworkLayer *nl, UA_Job **jobs) {
    ServerNetworkLayerTCP *layer = nl->handle;
    UA_LOG_INFO(layer->logger, UA_LOGCATEGORY_NETWORK,
                "Shutting down the TCP network layer with %d open connection(s)",
                layer->mappingsSize);
    shutdown((SOCKET)layer->serversockfd,2);
    CLOSESOCKET(layer->serversockfd);
    UA_Job *items = malloc(sizeof(UA_Job) * layer->mappingsSize * 2);
    if(!items)
        return 0;
    for(size_t i = 0; i < layer->mappingsSize; ++i) {
        socket_close(layer->mappings[i].connection);
        items[i*2].type = UA_JOBTYPE_DETACHCONNECTION;
        items[i*2].job.closeConnection = layer->mappings[i].connection;
        items[(i*2)+1].type = UA_JOBTYPE_METHODCALL_DELAYED;
        items[(i*2)+1].job.methodCall.method = FreeConnectionCallback;
        items[(i*2)+1].job.methodCall.data = layer->mappings[i].connection;
    }
#ifdef _WIN32
    WSACleanup();
#endif
    *jobs = items;
    return layer->mappingsSize*2;
}